

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall arangodb::velocypack::Parser::parseNumber(Parser *this)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  uint uVar6;
  uint uVar7;
  Exception *this_00;
  char *msg;
  Builder *this_01;
  bool bVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined4 uVar12;
  ParsedNumber numberValue;
  ParsedNumber exponent;
  ParsedNumber local_68;
  undefined1 local_48 [16];
  ParsedNumber local_38;
  
  uVar1 = this->_pos;
  local_68.intValue = 0;
  local_68.doubleValue = 0.0;
  local_68.isInteger = true;
  uVar7 = 0xffffffff;
  if (uVar1 < this->_size) {
    this->_pos = uVar1 + 1;
    uVar7 = (uint)this->_start[uVar1];
  }
  uVar6 = uVar7;
  if (uVar7 == 0x2d) {
    uVar2 = this->_pos;
    uVar6 = 0xffffffff;
    if (uVar2 < this->_size) {
      this->_pos = uVar2 + 1;
      uVar6 = (uint)this->_start[uVar2];
    }
    if (-1 < (int)uVar6) goto LAB_0010f16b;
    goto LAB_0010f49c;
  }
LAB_0010f16b:
  if (uVar6 - 0x3a < 0xfffffff6) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Expecting digit";
  }
  else {
    if (uVar6 != 0x30) {
      this->_pos = this->_pos - 1;
      scanDigits(this,&local_68);
    }
    uVar2 = this->_pos;
    uVar6 = 0xffffffff;
    if (uVar2 < this->_size) {
      this->_pos = uVar2 + 1;
      uVar6 = (uint)this->_start[uVar2];
    }
    uVar12 = (undefined4)(local_68.intValue >> 0x20);
    dVar10 = local_68.doubleValue;
    if (((int)uVar6 < 0) || ((uVar6 & 0x7fffffdf) != 0x45 && uVar6 != 0x2e)) {
      if (-1 < (int)uVar6) {
        this->_pos = this->_pos - 1;
      }
      if (local_68.isInteger == false) {
        this_01 = this->_builderPtr;
        if (uVar7 != 0x2d) goto LAB_0010f46e;
      }
      else {
        if (uVar7 != 0x2d) {
          Builder::addUInt(this->_builderPtr,local_68.intValue);
          return;
        }
        if (-1 < (long)local_68.intValue) {
          Builder::addInt(this->_builderPtr,-local_68.intValue);
          return;
        }
        this_01 = this->_builderPtr;
        auVar11._8_4_ = uVar12;
        auVar11._0_8_ = local_68.intValue;
        auVar11._12_4_ = 0x45300000;
        dVar10 = ((double)CONCAT44(0x43300000,(int)local_68.intValue) - 4503599627370496.0) +
                 (auVar11._8_8_ - 1.9342813113834067e+25);
      }
      dVar10 = -dVar10;
      goto LAB_0010f46e;
    }
    if (uVar6 == 0x2e) {
      uVar2 = this->_pos;
      uVar6 = 0xffffffff;
      if (uVar2 < this->_size) {
        this->_pos = uVar2 + 1;
        uVar6 = (uint)this->_start[uVar2];
      }
      if (((int)uVar6 < 0) || (uVar6 - 0x3a < 0xfffffff6)) goto LAB_0010f49c;
      this->_pos = this->_pos - 1;
      dVar9 = scanDigitsFractional(this);
      if (local_68.isInteger == false) {
        dVar5 = 0.0;
        dVar10 = local_68.doubleValue;
      }
      else {
        dVar5 = (double)CONCAT44(0x43300000,(int)local_68.intValue) - 4503599627370496.0;
        dVar10 = (double)CONCAT44(0x45300000,(int)(local_68.intValue >> 0x20)) -
                 1.9342813113834067e+25;
        auVar3._8_4_ = SUB84(dVar10,0);
        auVar3._0_8_ = dVar5;
        auVar3._12_4_ = (int)((ulong)dVar10 >> 0x20);
        dVar10 = dVar5 + dVar10;
        dVar5 = dVar5 + auVar3._8_8_;
      }
      if (uVar7 == 0x2d) {
        dVar5 = -dVar5;
        dVar10 = -dVar10 - dVar9;
      }
      else {
        dVar10 = dVar10 + dVar9;
      }
      uVar2 = this->_pos;
      uVar6 = 0xffffffff;
      if (uVar2 < this->_size) {
        this->_pos = uVar2 + 1;
        uVar6 = (uint)this->_start[uVar2];
      }
      if ((int)uVar6 < 0) {
        this_01 = this->_builderPtr;
        goto LAB_0010f46e;
      }
    }
    else {
      if (local_68.isInteger == false) {
        dVar5 = 0.0;
      }
      else {
        dVar5 = (double)CONCAT44(0x43300000,(int)local_68.intValue) - 4503599627370496.0;
        dVar10 = (double)CONCAT44(0x45300000,uVar12) - 1.9342813113834067e+25;
        auVar4._8_4_ = SUB84(dVar10,0);
        auVar4._0_8_ = dVar5;
        auVar4._12_4_ = (int)((ulong)dVar10 >> 0x20);
        dVar10 = dVar5 + dVar10;
        dVar5 = dVar5 + auVar4._8_8_;
      }
      if (uVar7 == 0x2d) {
        dVar10 = -dVar10;
        dVar5 = -dVar5;
      }
    }
    uVar2 = this->_pos;
    if ((uVar6 & 0x7fffffdf) != 0x45) {
      this->_pos = uVar2 - 1;
LAB_0010f45b:
      this_01 = this->_builderPtr;
      dVar10 = atof((char *)(this->_start + uVar1));
LAB_0010f46e:
      Builder::addDouble(this_01,dVar10);
      return;
    }
    uVar7 = 0xffffffff;
    if (uVar2 < this->_size) {
      this->_pos = uVar2 + 1;
      uVar7 = (uint)this->_start[uVar2];
    }
    if (-1 < (int)uVar7) {
      bVar8 = uVar7 == 0x2d;
      if ((bVar8) || (uVar7 == 0x2b)) {
        uVar2 = this->_pos;
        uVar7 = 0xffffffff;
        if (uVar2 < this->_size) {
          this->_pos = uVar2 + 1;
          uVar7 = (uint)this->_start[uVar2];
        }
        if ((int)uVar7 < 0) goto LAB_0010f49c;
      }
      else {
        bVar8 = false;
      }
      local_48._8_4_ = SUB84(dVar5,0);
      local_48._0_8_ = dVar10;
      local_48._12_4_ = (int)((ulong)dVar5 >> 0x20);
      if (0xfffffff5 < uVar7 - 0x3a) {
        this->_pos = this->_pos - 1;
        local_38.intValue = 0;
        local_38.doubleValue = 0.0;
        local_38.isInteger = true;
        scanDigits(this,&local_38);
        dVar10 = local_38.doubleValue;
        if (local_38.isInteger != false) {
          dVar10 = ((double)CONCAT44(0x43300000,(int)local_38.intValue) - 4503599627370496.0) +
                   ((double)CONCAT44(0x45300000,(int)(local_38.intValue >> 0x20)) -
                   1.9342813113834067e+25);
        }
        if (bVar8) {
          dVar10 = -dVar10;
        }
        dVar10 = pow(10.0,dVar10);
        if (0x7fefffffffffffff < (long)ABS((double)local_48._0_8_ * dVar10)) {
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          Exception::Exception(this_00,NumberOutOfRange);
          goto LAB_0010f4d3;
        }
        goto LAB_0010f45b;
      }
    }
LAB_0010f49c:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Incomplete number";
  }
  Exception::Exception(this_00,ParseError,msg);
LAB_0010f4d3:
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Parser::parseNumber() {
  std::size_t startPos = _pos;
  ParsedNumber numberValue;
  bool negative = false;
  int i = consume();
  // We know that a character is coming, and it's a number if it
  // starts with '-' or a digit. otherwise it's invalid
  if (i == '-') {
    i = getOneOrThrow("Incomplete number");
    negative = true;
  }
  if (i < '0' || i > '9') {
    throw Exception(Exception::ParseError, "Expecting digit");
  }

  if (i != '0') {
    unconsume();
    scanDigits(numberValue);
  }
  i = consume();
  if (i < 0 || (i != '.' && i != 'e' && i != 'E')) {
    if (i >= 0) {
      unconsume();
    }
    if (!numberValue.isInteger) {
      if (negative) {
        _builderPtr->addDouble(-numberValue.doubleValue);
      } else {
        _builderPtr->addDouble(numberValue.doubleValue);
      }
    } else if (negative) {
      if (numberValue.intValue <= static_cast<uint64_t>(INT64_MAX)) {
        _builderPtr->addInt(-static_cast<int64_t>(numberValue.intValue));
      } else if (numberValue.intValue == toUInt64(INT64_MIN)) {
        _builderPtr->addInt(INT64_MIN);
      } else {
        _builderPtr->addDouble(-static_cast<double>(numberValue.intValue));
      }
    } else {
      _builderPtr->addUInt(numberValue.intValue);
    }
    return;
  }

  double fractionalPart;
  if (i == '.') {
    // fraction. skip over '.'
    i = getOneOrThrow("Incomplete number");
    if (i < '0' || i > '9') {
      throw Exception(Exception::ParseError, "Incomplete number");
    }
    unconsume();
    fractionalPart = scanDigitsFractional();
    if (negative) {
      fractionalPart = -numberValue.asDouble() - fractionalPart;
    } else {
      fractionalPart = numberValue.asDouble() + fractionalPart;
    }
    i = consume();
    if (i < 0) {
      _builderPtr->addDouble(fractionalPart);
      return;
    }
  } else {
    if (negative) {
      fractionalPart = -numberValue.asDouble();
    } else {
      fractionalPart = numberValue.asDouble();
    }
  }
  if (i != 'e' && i != 'E') {
    unconsume();
    // use conventional atof() conversion here, to avoid precision loss
    // when interpreting and multiplying the single digits of the input stream
    // _builderPtr->addDouble(fractionalPart);
    _builderPtr->addDouble(
        atof(reinterpret_cast<char const*>(_start) + startPos));
    return;
  }
  i = getOneOrThrow("Incomplete number");
  negative = false;
  if (i == '+' || i == '-') {
    negative = (i == '-');
    i = getOneOrThrow("Incomplete number");
  }
  if (i < '0' || i > '9') {
    throw Exception(Exception::ParseError, "Incomplete number");
  }
  unconsume();
  ParsedNumber exponent;
  scanDigits(exponent);
  if (negative) {
    fractionalPart *= pow(10, -exponent.asDouble());
  } else {
    fractionalPart *= pow(10, exponent.asDouble());
  }
  if (std::isnan(fractionalPart) || !std::isfinite(fractionalPart)) {
    throw Exception(Exception::NumberOutOfRange);
  }
  // use conventional atof() conversion here, to avoid precision loss
  // when interpreting and multiplying the single digits of the input stream
  // _builderPtr->addDouble(fractionalPart);
  _builderPtr->addDouble(
      atof(reinterpret_cast<char const*>(_start) + startPos));
}